

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

QWidgetList * __thiscall
QAccessibleAbstractScrollArea::accessibleChildren
          (QWidgetList *__return_storage_ptr__,QAccessibleAbstractScrollArea *this)

{
  AbstractScrollAreaElement AVar1;
  QAbstractScrollArea *pQVar2;
  QWidget *pQVar3;
  QScrollBar *pQVar4;
  long in_FS_OFFSET;
  QWidget *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QWidget **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar2 = (QAbstractScrollArea *)
           (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar3 = QAbstractScrollArea::viewport(pQVar2);
  if (pQVar3 != (QWidget *)0x0) {
    local_28 = pQVar3;
    QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
              ((QPodArrayOps<QWidget*> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               &local_28);
    QList<QWidget_*>::end(__return_storage_ptr__);
  }
  pQVar2 = (QAbstractScrollArea *)
           (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar4 = QAbstractScrollArea::horizontalScrollBar(pQVar2);
  if ((pQVar4 != (QScrollBar *)0x0) &&
     ((((pQVar4->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0)) {
    pQVar3 = *(QWidget **)(*(long *)&(pQVar4->super_QAbstractSlider).super_QWidget.field_0x8 + 0x10)
    ;
    AVar1 = elementType(this,pQVar3);
    if (AVar1 == HorizontalContainer) {
      local_28 = pQVar3;
      QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                ((QPodArrayOps<QWidget*> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 &local_28);
      QList<QWidget_*>::end(__return_storage_ptr__);
    }
  }
  pQVar2 = (QAbstractScrollArea *)
           (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar4 = QAbstractScrollArea::verticalScrollBar(pQVar2);
  if ((pQVar4 != (QScrollBar *)0x0) &&
     ((((pQVar4->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0)) {
    pQVar3 = *(QWidget **)(*(long *)&(pQVar4->super_QAbstractSlider).super_QWidget.field_0x8 + 0x10)
    ;
    AVar1 = elementType(this,pQVar3);
    if (AVar1 == VerticalContainer) {
      local_28 = pQVar3;
      QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                ((QPodArrayOps<QWidget*> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 &local_28);
      QList<QWidget_*>::end(__return_storage_ptr__);
    }
  }
  pQVar2 = (QAbstractScrollArea *)
           (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar3 = QAbstractScrollArea::cornerWidget(pQVar2);
  if ((pQVar3 != (QWidget *)0x0) && ((pQVar3->data->widget_attributes & 0x8000) != 0)) {
    local_28 = pQVar3;
    QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
              ((QPodArrayOps<QWidget*> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               &local_28);
    QList<QWidget_*>::end(__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetList QAccessibleAbstractScrollArea::accessibleChildren() const
{
    QWidgetList children;

    // Viewport.
    QWidget * viewport = abstractScrollArea()->viewport();
    if (viewport)
        children.append(viewport);

    // Horizontal scrollBar container.
    QScrollBar *horizontalScrollBar = abstractScrollArea()->horizontalScrollBar();
    if (horizontalScrollBar && horizontalScrollBar->isVisible()) {
        QWidget *scrollBarParent = horizontalScrollBar->parentWidget();
        // Add container only if scroll bar is in the container
        if (elementType(scrollBarParent) == HorizontalContainer)
            children.append(scrollBarParent);
    }

    // Vertical scrollBar container.
    QScrollBar *verticalScrollBar = abstractScrollArea()->verticalScrollBar();
    if (verticalScrollBar && verticalScrollBar->isVisible()) {
        QWidget *scrollBarParent = verticalScrollBar->parentWidget();
        // Add container only if scroll bar is in the container
        if (elementType(scrollBarParent) == VerticalContainer)
            children.append(scrollBarParent);
    }

    // CornerWidget.
    QWidget *cornerWidget = abstractScrollArea()->cornerWidget();
    if (cornerWidget && cornerWidget->isVisible())
        children.append(cornerWidget);

    return children;
}